

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.cpp
# Opt level: O2

void * PathfinderDVLThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  double local_c68;
  double local_c60;
  interval local_c58;
  int local_c40;
  int local_c3c;
  interval local_c38;
  interval local_c20;
  double local_c08;
  CHRONO chrono_period;
  char szTemp [256];
  NMEADATA nmeadata;
  PATHFINDERDVL pathfinderdvl;
  char szSaveFilePath [256];
  
  memset(&pathfinderdvl,0,0x5a0);
  memset(&nmeadata,0,0x3d8);
  StartChrono(&chrono_period);
  local_c40 = 100;
  bVar2 = false;
  local_c3c = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      if (bPausePathfinderDVL == 0) break;
      if (!bVar2) {
        puts("PathfinderDVL paused.");
        DisconnectPathfinderDVL(&pathfinderdvl);
      }
      if (bExit != 0) goto LAB_0017ace7;
      mSleep(100);
      bVar2 = true;
    }
    if (bRestartPathfinderDVL == 0) {
      if (bVar2) goto LAB_0017a651;
      iVar4 = GetNMEASentencePathfinderDVL(&pathfinderdvl,&nmeadata);
      if (iVar4 == 0) {
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        auVar9._0_4_ = -(uint)(pathfinderdvl.bEnable_PD6_SA == 0);
        auVar9._4_4_ = -(uint)(pathfinderdvl.bEnable_PD6_TS == 0);
        auVar9._8_4_ = -(uint)(pathfinderdvl.bEnable_PD6_BI == 0);
        auVar9._12_4_ = -(uint)(pathfinderdvl.bEnable_PD6_BS == 0);
        iVar4 = movmskps(iVar4,auVar9);
        if (((iVar4 != 0xf) || (pathfinderdvl.bEnable_PD6_BE != 0)) ||
           (pathfinderdvl.bEnable_PD6_BD != 0)) {
          if ((~auVar9._0_4_ & 1) != 0) {
            local_c68 = fmod_2PI((1.5707963267948966 - nmeadata.Heading) - angle_env);
            interval::interval(&local_c20,&local_c68);
            local_c60 = -psi_ahrs_acc;
            interval::interval(&local_c58,&local_c60,&psi_ahrs_acc);
            operator+(&local_c20,&local_c58);
            interval::operator=((interval *)&psi_ahrs,&local_c38);
            local_c68 = -nmeadata.Pitch;
            interval::interval(&local_c20,&local_c68);
            local_c60 = -theta_ahrs_acc;
            interval::interval(&local_c58,&local_c60,&theta_ahrs_acc);
            operator+(&local_c20,&local_c58);
            interval::operator=((interval *)&theta_ahrs,&local_c38);
            interval::interval(&local_c20,&nmeadata.Roll);
            local_c68 = (double)((ulong)phi_ahrs_acc ^ (ulong)DAT_0018d0f0);
            interval::interval(&local_c58,&local_c68,&phi_ahrs_acc);
            operator+(&local_c20,&local_c58);
            interval::operator=((interval *)&phi_ahrs,&local_c38);
          }
          if (pathfinderdvl.bEnable_PD6_BS != 0) {
            if (nmeadata.vstatus_ship == 'V') {
              local_c20.inf = -10000.0;
              local_c58.inf = 10000.0;
              interval::interval(&local_c38,&local_c20.inf,&local_c58.inf);
              interval::operator=((interval *)&vrx_dvl,&local_c38);
              local_c20.inf = -10000.0;
              local_c58.inf = 10000.0;
              interval::interval(&local_c38,&local_c20.inf,&local_c58.inf);
              interval::operator=((interval *)&vry_dvl,&local_c38);
              local_c20.inf = -10000.0;
              local_c58.inf = 10000.0;
              interval::interval(&local_c38,&local_c20.inf,&local_c58.inf);
            }
            else {
              if (nmeadata.vstatus_ship != 'A') goto LAB_0017abd4;
              interval::interval(&local_c20,&nmeadata.vl_ship);
              local_c68 = -dvl_acc;
              interval::interval(&local_c58,&local_c68,&dvl_acc);
              operator+(&local_c20,&local_c58);
              interval::operator=((interval *)&vrx_dvl,&local_c38);
              local_c68 = -nmeadata.vt_ship;
              interval::interval(&local_c20,&local_c68);
              local_c60 = -dvl_acc;
              interval::interval(&local_c58,&local_c60,&dvl_acc);
              operator+(&local_c20,&local_c58);
              interval::operator=((interval *)&vry_dvl,&local_c38);
              interval::interval(&local_c20,&nmeadata.vn_ship);
              local_c68 = (double)((ulong)dvl_acc ^ (ulong)DAT_0018d0f0);
              interval::interval(&local_c58,&local_c68,&dvl_acc);
              operator+(&local_c20,&local_c58);
            }
            interval::operator=((interval *)&vrz_dvl,&local_c38);
          }
LAB_0017abd4:
          if ((pathfinderdvl.bEnable_PD6_BE != 0) && (nmeadata.vstatus_earth == 'A')) {
            sog = nmeadata.SOG;
            local_c68 = fmod_2PI((1.5707963267948966 - nmeadata.COG) - angle_env);
            interval::interval(&local_c20,&local_c68);
            local_c60 = -3.141592653589793;
            local_c08 = 3.141592653589793;
            interval::interval(&local_c58,&local_c60,&local_c08);
            operator+(&local_c20,&local_c58);
            interval::operator=((interval *)&psi_dvl,&local_c38);
          }
          if ((pathfinderdvl.bEnable_PD6_BD != 0) && (nmeadata.timesincelastgood < 4.0)) {
            altitude_AGL = nmeadata.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_0017accc;
      }
      puts("Connection to a PathfinderDVL lost.");
      DisconnectPathfinderDVL(&pathfinderdvl);
      lVar8 = (long)local_c40;
LAB_0017a669:
      mSleep(lVar8);
      local_c3c = local_c3c + 1;
      if (ExitOnErrorCount <= local_c3c && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0017ace7:
        bVar3 = true;
        goto LAB_0017acea;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a PathfinderDVL.");
        DisconnectPathfinderDVL(&pathfinderdvl);
      }
      bRestartPathfinderDVL = 0;
LAB_0017a651:
      iVar4 = ConnectPathfinderDVL(&pathfinderdvl,"PathfinderDVL0.txt");
      lVar8 = 1000;
      if (iVar4 != 0) goto LAB_0017a669;
      local_c40 = pathfinderdvl.threadperiod;
      memset(&nmeadata,0,0x3d8);
      if (pathfinderdvl.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)pathfinderdvl.pfSaveFile);
        pathfinderdvl.pfSaveFile = (FILE *)0x0;
      }
      if (pathfinderdvl.bSaveRawData == 0) {
LAB_0017accc:
        bVar3 = false;
        bVar2 = true;
      }
      else {
        if (pathfinderdvl.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp + 8,"erdvl",6);
          builtin_strncpy(szTemp,"pathfind",8);
        }
        else {
          sprintf(szTemp,"%.127s",pathfinderdvl.szCfgFilePath);
        }
        sVar5 = strlen(szTemp);
        iVar4 = (int)sVar5 + 1;
        uVar7 = sVar5 & 0xffffffff;
        do {
          if ((int)uVar7 < 1) goto LAB_0017a7bb;
          uVar1 = uVar7 - 1;
          iVar4 = iVar4 + -1;
          lVar8 = uVar7 - 1;
          uVar7 = uVar1;
        } while (szTemp[lVar8] != '.');
        if ((uVar1 != 0) && (iVar4 <= (int)sVar5)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar5 - (uVar1 & 0xffffffff));
        }
LAB_0017a7bb:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar6 = strtimeex_fns();
        bVar3 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar6);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        pathfinderdvl.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
        bVar2 = true;
        if ((FILE *)pathfinderdvl.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create PathfinderDVL data file.");
          bVar3 = false;
          goto LAB_0017acea;
        }
      }
    }
    if (bExit != 0) {
LAB_0017acea:
      StopChronoQuick(&chrono_period);
      if (pathfinderdvl.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)pathfinderdvl.pfSaveFile);
        pathfinderdvl.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        DisconnectPathfinderDVL(&pathfinderdvl);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE PathfinderDVLThread(void* pParam)
{
	PATHFINDERDVL pathfinderdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&pathfinderdvl, 0, sizeof(PATHFINDERDVL));
	
	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPausePathfinderDVL)
		{
			if (bConnected)
			{
				printf("PathfinderDVL paused.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartPathfinderDVL)
		{
			if (bConnected)
			{
				printf("Restarting a PathfinderDVL.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
			}
			bRestartPathfinderDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectPathfinderDVL(&pathfinderdvl, "PathfinderDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = pathfinderdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (pathfinderdvl.pfSaveFile != NULL)
				{
					fclose(pathfinderdvl.pfSaveFile); 
					pathfinderdvl.pfSaveFile = NULL;
				}
				if ((pathfinderdvl.bSaveRawData)&&(pathfinderdvl.pfSaveFile == NULL)) 
				{
					if (strlen(pathfinderdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", pathfinderdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "pathfinderdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					pathfinderdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (pathfinderdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create PathfinderDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentencePathfinderDVL(&pathfinderdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (pathfinderdvl.bEnable_PD6_SA||pathfinderdvl.bEnable_PD6_TS||pathfinderdvl.bEnable_PD6_BI||pathfinderdvl.bEnable_PD6_BS||
					pathfinderdvl.bEnable_PD6_BE||pathfinderdvl.bEnable_PD6_BD)
				{
					if (pathfinderdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (pathfinderdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (pathfinderdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a PathfinderDVL lost.\n");
				bConnected = FALSE;
				DisconnectPathfinderDVL(&pathfinderdvl);
				mSleep(threadperiod);
			}
		}

		//printf("PathfinderDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (pathfinderdvl.pfSaveFile != NULL)
	{
		fclose(pathfinderdvl.pfSaveFile); 
		pathfinderdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectPathfinderDVL(&pathfinderdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}